

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O0

QString * __thiscall QTextFragment::text(QTextFragment *this)

{
  QTextFragmentData *pQVar1;
  QChar *pQVar2;
  long *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QTextFragmentData *frag;
  int f;
  QString *result;
  QString buffer;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  QString *this_00;
  uint local_50;
  QString local_38;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RSI == 0) || ((int)in_RSI[1] == 0)) {
    QString::QString((QString *)0x88f002);
  }
  else {
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = in_RDI;
    QString::QString((QString *)0x88f036);
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocumentPrivate::buffer
              ((QTextDocumentPrivate *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
              );
    local_50 = *(uint *)(in_RSI + 1);
    while (local_50 != *(uint *)((long)in_RSI + 0xc)) {
      QTextDocumentPrivate::fragmentMap((QTextDocumentPrivate *)*in_RSI);
      pQVar1 = QFragmentMap<QTextFragmentData>::fragment
                         ((QFragmentMap<QTextFragmentData> *)this_00,in_stack_ffffffffffffff8c);
      pQVar2 = QString::constData((QString *)0x88f0b2);
      QString::QString(&local_38,pQVar2 + pQVar1->stringPosition,
                       (ulong)(pQVar1->super_QFragment<1>).size_array[0]);
      QString::operator+=(this_00,(QString *)
                                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      QString::~QString((QString *)0x88f0f1);
      QTextDocumentPrivate::fragmentMap((QTextDocumentPrivate *)*in_RSI);
      local_50 = QFragmentMap<QTextFragmentData>::next
                           ((QFragmentMap<QTextFragmentData> *)this_00,in_stack_ffffffffffffff8c);
    }
    QString::~QString((QString *)0x88f122);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QTextFragment::text() const
{
    if (!p || !n)
        return QString();

    QString result;
    QString buffer = p->buffer();
    int f = n;
    while (f != ne) {
        const QTextFragmentData * const frag = p->fragmentMap().fragment(f);
        result += QString(buffer.constData() + frag->stringPosition, frag->size_array[0]);
        f = p->fragmentMap().next(f);
    }
    return result;
}